

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Vector<kj::ArrayPtr<const_char>_> * __thiscall
kj::_::splitParts(Vector<kj::ArrayPtr<const_char>_> *__return_storage_ptr__,_ *this,
                 ArrayPtr<const_char> input,char delim)

{
  RemoveConst<kj::ArrayPtr<const_char>_> **ppRVar1;
  ArrayPtr<const_char> *pAVar2;
  ArrayPtr<const_char> *pAVar3;
  RemoveConst<kj::ArrayPtr<const_char>_> *pRVar4;
  size_t newSize;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  
  local_38.size_ = (size_t)input.ptr;
  (__return_storage_ptr__->builder).ptr = (ArrayPtr<const_char> *)0x0;
  (__return_storage_ptr__->builder).pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x0;
  (__return_storage_ptr__->builder).endPtr = (ArrayPtr<const_char> *)0x0;
  (__return_storage_ptr__->builder).disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  if ((char *)local_38.size_ != (char *)0x0) {
    local_38.ptr = (char *)this;
    do {
      local_48 = splitNext(&local_38,(char)input.size_);
      stripLeadingAndTrailingSpace(&local_48);
      pAVar2 = (__return_storage_ptr__->builder).endPtr;
      if ((__return_storage_ptr__->builder).pos == pAVar2) {
        pAVar3 = (__return_storage_ptr__->builder).ptr;
        newSize = (long)pAVar2 - (long)pAVar3 >> 3;
        if (pAVar2 == pAVar3) {
          newSize = 4;
        }
        Vector<kj::ArrayPtr<const_char>_>::setCapacity(__return_storage_ptr__,newSize);
      }
      pRVar4 = (__return_storage_ptr__->builder).pos;
      pRVar4->ptr = local_48.ptr;
      pRVar4->size_ = local_48.size_;
      ppRVar1 = &(__return_storage_ptr__->builder).pos;
      *ppRVar1 = *ppRVar1 + 1;
    } while ((char *)local_38.size_ != (char *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Vector<kj::ArrayPtr<const char>> splitParts(kj::ArrayPtr<const char> input, char delim) {
  // Given a string `input` and a delimiter `delim`, split the string into a vector of substrings,
  // separated by the delimiter. Note that leading/trailing whitespace is stripped from each element.
  kj::Vector<kj::ArrayPtr<const char>> parts;

  while (input.size() != 0) {
    auto part = splitNext(input, delim);
    stripLeadingAndTrailingSpace(part);
    parts.add(kj::mv(part));
  }

  return parts;
}